

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeVirtualMemMap
          (ze_context_handle_t hContext,void *ptr,size_t size,
          ze_physical_mem_handle_t hPhysicalMemory,size_t offset,ze_memory_access_attribute_t access
          )

{
  ze_result_t zVar1;
  
  if (DAT_0010d700 != (code *)0x0) {
    zVar1 = (*DAT_0010d700)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeVirtualMemMap(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] pointer to start of virtual address range to map.
        size_t size,                                    ///< [in] size in bytes of virtual address range to map; must be page
                                                        ///< aligned.
        ze_physical_mem_handle_t hPhysicalMemory,       ///< [in] handle to physical memory object.
        size_t offset,                                  ///< [in] offset into physical memory allocation object; must be page
                                                        ///< aligned.
        ze_memory_access_attribute_t access             ///< [in] specifies page access attributes to apply to the virtual address
                                                        ///< range.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnMap = context.zeDdiTable.VirtualMem.pfnMap;
        if( nullptr != pfnMap )
        {
            result = pfnMap( hContext, ptr, size, hPhysicalMemory, offset, access );
        }
        else
        {
            // generic implementation
        }

        return result;
    }